

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi_is_hdr_from_callbacks(stbi_io_callbacks *clbk,void *user)

{
  int iVar1;
  undefined1 local_f8 [8];
  stbi__context s;
  void *user_local;
  stbi_io_callbacks *clbk_local;
  
  s.img_buffer_original_end = (stbi_uc *)user;
  stbi__start_callbacks((stbi__context *)local_f8,clbk,user);
  iVar1 = stbi__hdr_test((stbi__context *)local_f8);
  return iVar1;
}

Assistant:

STBIDEF int      stbi_is_hdr_from_callbacks(stbi_io_callbacks const *clbk, void *user)
{
   #ifndef STBI_NO_HDR
   stbi__context s;
   stbi__start_callbacks(&s, (stbi_io_callbacks *) clbk, user);
   return stbi__hdr_test(&s);
   #else
   STBI_NOTUSED(clbk);
   STBI_NOTUSED(user);
   return 0;
   #endif
}